

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O3

void __thiscall
Js::JavascriptBigInt::InitFromCharDigits<char16_t>
          (JavascriptBigInt *this,char16_t *pChar,uint32 charLength,bool isNegative)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Recycler *this_00;
  unsigned_long *puVar6;
  undefined7 in_register_00000009;
  char16_t *pcVar7;
  digit_t digitAdd;
  digit_t digitMul;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  if (pChar == (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x94,"(pChar != 0)","pChar != 0");
    if (!bVar3) goto LAB_00d22b32;
    *puVar5 = 0;
  }
  data._36_4_ = SUB84(CONCAT71(in_register_00000009,isNegative),0);
  this->m_length = 0;
  data.plusSize = this->m_maxLength;
  local_70 = (undefined1  [8])&unsigned_long::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_82e85b8;
  data.filename._0_4_ = 0x99;
  this_00 = Memory::Recycler::TrackAllocInfo
                      (((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                       (TrackAllocData *)local_70);
  uVar1 = this->m_maxLength;
  if (uVar1 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    puVar6 = (unsigned_long *)&DAT_00000008;
  }
  else {
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00d22b32;
      *puVar5 = 0;
    }
    puVar6 = (unsigned_long *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (this_00,-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
    if (puVar6 == (unsigned_long *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00d22b32;
      *puVar5 = 0;
      puVar6 = (unsigned_long *)0x0;
    }
  }
  pcVar7 = pChar + ((ulong)charLength - 1);
  Memory::Recycler::WBSetBit((char *)&this->m_digits);
  (this->m_digits).ptr = puVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_digits);
  this->m_isNegative = data._36_1_;
  digitMul = 1;
  if (pChar < pcVar7) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    digitAdd = 0;
    do {
      bVar3 = NumberUtilities::IsDigit((uint)(ushort)*pChar);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                    ,0xa0,"(NumberUtilities::IsDigit(*pChar))",
                                    "NumberUtilities::IsDigit(*pChar)");
        if (!bVar3) goto LAB_00d22b32;
        *puVar5 = 0;
      }
      if (digitMul == 1000000000) {
        MulThenAdd(this,1000000000,digitAdd);
        digitMul = 1;
        digitAdd = 0;
      }
      digitMul = digitMul * 10;
      digitAdd = ((ulong)(ushort)*pChar + digitAdd * 10) - 0x30;
      pChar = pChar + 1;
    } while (pChar < pcVar7);
    if (digitMul != 0) goto LAB_00d22af7;
  }
  else {
    digitAdd = 0;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar5 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                              ,0xaa,"(1 < digitMul)","1 < digitMul");
  if (!bVar3) {
LAB_00d22b32:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
LAB_00d22af7:
  MulThenAdd(this,digitMul,digitAdd);
  if (this->m_length == 0) {
    this->m_isNegative = false;
    this->m_length = 1;
    *(this->m_digits).ptr = 0;
  }
  return;
}

Assistant:

void JavascriptBigInt::InitFromCharDigits(const EncodedChar *pChar, uint32 charLength, bool isNegative)
    {
        Assert(charLength >= 0);
        Assert(pChar != 0);

        const EncodedChar *pCharLimit = pChar + charLength - 1;//'n' at the end

        m_length = 0;
        m_digits = RecyclerNewArrayLeaf(this->GetScriptContext()->GetRecycler(), digit_t, m_maxLength);
        m_isNegative = isNegative;

        digit_t digitMul = 1;
        digit_t digitAdd = 0;
        for (; pChar < pCharLimit; pChar++)
        {
            Assert(NumberUtilities::IsDigit(*pChar));
            if (digitMul == 1e9)
            {
                MulThenAdd(digitMul, digitAdd);
                digitMul = 1;
                digitAdd = 0;
            }
            digitMul *= 10;
            digitAdd = digitAdd * 10 + *pChar - '0';
        }
        Assert(1 < digitMul);
        MulThenAdd(digitMul, digitAdd);

        // make sure this is no negative zero
        if (m_length == 0)
        {
            m_isNegative = false;
            m_length = 1;
            m_digits[0] = 0;
        }
    }